

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O1

int hclose(hFILE *fp)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  
  iVar3 = fp->has_errno;
  if (fp->end < fp->begin) {
    iVar1 = hflush(fp);
    if (iVar1 < 0) {
      iVar3 = fp->has_errno;
    }
  }
  iVar1 = (*fp->backend->close)(fp);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    iVar3 = *piVar2;
  }
  hfile_destroy(fp);
  if (iVar3 == 0) {
    iVar3 = 0;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = iVar3;
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int hclose(hFILE *fp)
{
    int err = fp->has_errno;

    if (writebuffer_is_nonempty(fp) && hflush(fp) < 0) err = fp->has_errno;
    if (fp->backend->close(fp) < 0) err = errno;
    hfile_destroy(fp);

    if (err) {
        errno = err;
        return EOF;
    }
    else return 0;
}